

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::replace_reduction_with_global_pooling(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  Layer *pLVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  Layer *pLVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ParamDict pd;
  ParamDict local_40;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar8 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    uVar9 = lVar8 >> 3;
    lVar8 = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar8]->type);
      if ((((iVar5 == 0) &&
           (pLVar2 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar8], *(int *)&pLVar2[1]._vptr_Layer == 3))
          && (*(int *)((long)&pLVar2[1]._vptr_Layer + 4) == 0)) &&
         (((*(float *)&pLVar2[1].one_blob_only == 1.0 && (!NAN(*(float *)&pLVar2[1].one_blob_only)))
          && ((*(int *)((long)&pLVar2[1].type._M_string_length + 4) == 1 &&
              ((**(uint **)&pLVar2[1].support_tensor_storage & 0xfffffffe) == 2)))))) {
        uVar10 = lVar8 + 1;
        if (uVar10 < uVar9) {
          iVar5 = *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar6 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar10]->type);
            if (((iVar6 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar10],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 == 4)) && (*piVar4 == iVar5))
            goto LAB_0014b899;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar9);
        }
        else {
LAB_0014b899:
          if (((((uVar10 != uVar9) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar10],
                *(int *)&pLVar3[1]._vptr_Layer == 3)) &&
               (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0)) &&
              ((*(float *)&pLVar3[1].one_blob_only == 1.0 &&
               (!NAN(*(float *)&pLVar3[1].one_blob_only))))) &&
             ((*(int *)((long)&pLVar3[1].type._M_string_length + 4) == 1 &&
              (**(int **)&pLVar3[1].support_tensor_storage == 2)))) {
            fprintf(_stderr,"replace_reduction_with_global_pooling %s %s\n",
                    (pLVar2->name)._M_dataplus._M_p,(pLVar3->name)._M_dataplus._M_p);
            pLVar7 = ncnn::create_layer("Pooling");
            std::__cxx11::string::operator=((string *)&pLVar7->type,"Pooling");
            std::__cxx11::string::_M_assign((string *)&pLVar7->name);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar7->bottoms,&pLVar3->bottoms);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar7->tops,&pLVar3->tops);
            ncnn::ParamDict::ParamDict(&local_40);
            (*pLVar7->_vptr_Layer[2])(pLVar7,&local_40);
            *(undefined4 *)&pLVar7[1]._vptr_Layer = 1;
            *(undefined4 *)((long)&pLVar7[1].userdata + 4) = 1;
            (((this->super_ModelWriter).layers)->
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar10] = pLVar7;
            (*pLVar3->_vptr_Layer[1])();
            iVar5 = *(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar5;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar5].consumer = (int)uVar10;
            std::__cxx11::string::operator=((string *)&pLVar2->type,"ncnnfused");
            ncnn::ParamDict::~ParamDict(&local_40);
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != uVar9 + (uVar9 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::replace_reduction_with_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Reduction")
            continue;

        ncnn::Reduction* reduction1 = (ncnn::Reduction*)layers[i];
        if (reduction1->operation != 3 || reduction1->reduce_all != 0 || reduction1->coeff != 1.f)
            continue;

        if (reduction1->axes.w != 1)
            continue;

        const int* axes_ptr = reduction1->axes;
        if (axes_ptr[0] != 2 && axes_ptr[0] != 3)
            continue;

        // Reduction(2/3) - Reduction(2)
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Reduction")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Reduction* reduction2 = (ncnn::Reduction*)layers[j];
        if (reduction2->operation != 3 || reduction2->reduce_all != 0 || reduction2->coeff != 1.f)
            continue;

        if (reduction2->axes.w != 1)
            continue;

        const int* axes2_ptr = reduction2->axes;
        if (axes2_ptr[0] != 2)
            continue;

        fprintf(stderr, "replace_reduction_with_global_pooling %s %s\n", reduction1->name.c_str(), reduction2->name.c_str());

        ncnn::Pooling* pooling = (ncnn::Pooling*)ncnn::create_layer("Pooling");

        pooling->type = "Pooling";
        pooling->name = reduction2->name;
        pooling->bottoms = reduction2->bottoms;
        pooling->tops = reduction2->tops;

        ncnn::ParamDict pd;
        pooling->load_param(pd);

        pooling->pooling_type = 1;
        pooling->global_pooling = 1;

        layers[j] = pooling;
        delete reduction2;

        int bottom_blob_index_final = reduction1->bottoms[0];
        pooling->bottoms[0] = bottom_blob_index_final;
        blobs[bottom_blob_index_final].consumer = j;
        reduction1->type = "ncnnfused";
    }

    return 0;
}